

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O1

int Abc_CommandBlast(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wlc_Ntk_t *p;
  bool bVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *vBoxIds;
  Gia_Man_t *pNew;
  char *pcVar4;
  char *pcVar5;
  uint fGiaSimple;
  uint local_44;
  
  p = (Wlc_Ntk_t *)pAbc->pAbcWlc;
  fGiaSimple = 0;
  Extra_UtilGetoptReset();
  local_44 = 0;
  bVar1 = false;
  bVar2 = false;
  while( true ) {
    while( true ) {
      while( true ) {
        while (iVar3 = Extra_UtilGetopt(argc,argv,"comvh"), iVar3 == 0x76) {
          bVar2 = (bool)(bVar2 ^ 1);
        }
        if (0x6c < iVar3) break;
        if (iVar3 == -1) {
          if (p == (Wlc_Ntk_t *)0x0) {
            pcVar4 = "Abc_CommandBlast(): There is no current design.\n";
          }
          else {
            if (bVar1) {
              vBoxIds = Wlc_NtkCollectMultipliers(p);
              if (vBoxIds == (Vec_Int_t *)0x0) {
                Abc_Print(1,"Warning:  There is no multipliers in the design.\n");
              }
            }
            else {
              vBoxIds = (Vec_Int_t *)0x0;
            }
            pNew = Wlc_NtkBitBlast(p,vBoxIds,fGiaSimple,local_44);
            if (vBoxIds != (Vec_Int_t *)0x0) {
              if (vBoxIds->pArray != (int *)0x0) {
                free(vBoxIds->pArray);
                vBoxIds->pArray = (int *)0x0;
              }
              free(vBoxIds);
            }
            if (pNew != (Gia_Man_t *)0x0) {
              Abc_FrameUpdateGia(pAbc,pNew);
              return 0;
            }
            pcVar4 = "Abc_CommandBlast(): Bit-blasting has failed.\n";
          }
          Abc_Print(1,pcVar4);
          return 0;
        }
        if (iVar3 != 99) goto LAB_0030bb24;
        fGiaSimple = fGiaSimple ^ 1;
      }
      if (iVar3 != 0x6d) break;
      bVar1 = (bool)(bVar1 ^ 1);
    }
    if (iVar3 != 0x6f) break;
    local_44 = local_44 ^ 1;
  }
LAB_0030bb24:
  Abc_Print(-2,"usage: %%blast [-comvh]\n");
  Abc_Print(-2,"\t         performs bit-blasting of the word-level design\n");
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (fGiaSimple == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (local_44 == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,
            "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (!bVar1) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n"
            ,pcVar4);
  if (!bVar2) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
}

Assistant:

int Abc_CommandBlast( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Wlc_Ntk_t * pNtk = Wlc_AbcGetNtk(pAbc);
    Vec_Int_t * vBoxIds = NULL;
    Gia_Man_t * pNew = NULL;
    int c, fGiaSimple = 0, fAddOutputs = 0, fMulti = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "comvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fGiaSimple ^= 1;
            break;
        case 'o':
            fAddOutputs ^= 1;
            break;
        case 'm':
            fMulti ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): There is no current design.\n" );
        return 0;
    }
    if ( fMulti )
    {
        vBoxIds = Wlc_NtkCollectMultipliers( pNtk );
        if ( vBoxIds == NULL )
            Abc_Print( 1, "Warning:  There is no multipliers in the design.\n" );
    }
    // transform
    pNew = Wlc_NtkBitBlast( pNtk, vBoxIds, fGiaSimple, fAddOutputs );
    Vec_IntFreeP( &vBoxIds );
    if ( pNew == NULL )
    {
        Abc_Print( 1, "Abc_CommandBlast(): Bit-blasting has failed.\n" );
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pNew );
    return 0;
usage:
    Abc_Print( -2, "usage: %%blast [-comvh]\n" );
    Abc_Print( -2, "\t         performs bit-blasting of the word-level design\n" );
    Abc_Print( -2, "\t-c     : toggle using AIG w/o const propagation and strashing [default = %s]\n", fGiaSimple? "yes": "no" );
    Abc_Print( -2, "\t-o     : toggle using additional POs on the word-level boundaries [default = %s]\n", fAddOutputs? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle creating boxes for all multipliers in the design [default = %s]\n", fMulti? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}